

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlDumpElementDecl(xmlBufferPtr buf,xmlElementPtr elem)

{
  char *string;
  
  if (elem != (xmlElementPtr)0x0 && buf != (xmlBufferPtr)0x0) {
    switch(elem->etype) {
    case XML_ELEMENT_TYPE_EMPTY:
      xmlBufferWriteChar(buf,"<!ELEMENT ");
      if (elem->prefix != (xmlChar *)0x0) {
        xmlBufferWriteCHAR(buf,elem->prefix);
        xmlBufferWriteChar(buf,":");
      }
      xmlBufferWriteCHAR(buf,elem->name);
      string = " EMPTY>\n";
      break;
    case XML_ELEMENT_TYPE_ANY:
      xmlBufferWriteChar(buf,"<!ELEMENT ");
      if (elem->prefix != (xmlChar *)0x0) {
        xmlBufferWriteCHAR(buf,elem->prefix);
        xmlBufferWriteChar(buf,":");
      }
      xmlBufferWriteCHAR(buf,elem->name);
      string = " ANY>\n";
      break;
    case XML_ELEMENT_TYPE_MIXED:
    case XML_ELEMENT_TYPE_ELEMENT:
      xmlBufferWriteChar(buf,"<!ELEMENT ");
      if (elem->prefix != (xmlChar *)0x0) {
        xmlBufferWriteCHAR(buf,elem->prefix);
        xmlBufferWriteChar(buf,":");
      }
      xmlBufferWriteCHAR(buf,elem->name);
      xmlBufferWriteChar(buf," ");
      xmlDumpElementContent(buf,elem->content);
      string = ">\n";
      break;
    default:
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s","Internal: ELEMENT struct corrupted invalid type\n");
      return;
    }
    xmlBufferWriteChar(buf,string);
    return;
  }
  return;
}

Assistant:

void
xmlDumpElementDecl(xmlBufferPtr buf, xmlElementPtr elem) {
    if ((buf == NULL) || (elem == NULL))
        return;
    switch (elem->etype) {
	case XML_ELEMENT_TYPE_EMPTY:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " EMPTY>\n");
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ANY>\n");
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ");
	    xmlDumpElementContent(buf, elem->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ");
	    xmlDumpElementContent(buf, elem->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT struct corrupted invalid type\n",
		    NULL);
    }
}